

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O0

int BackwardReferencesHashChainDistanceOnly
              (int xsize,int ysize,uint32_t *argb,int cache_bits,VP8LHashChain *hash_chain,
              VP8LBackwardRefs *refs,uint16_t *dist_array)

{
  int do_clean_intervals;
  int iVar1;
  CostManager *manager;
  void *distance_cost;
  uint32_t *argb_00;
  int in_ECX;
  int in_ESI;
  int in_EDI;
  long in_R9;
  int *in_stack_00000008;
  int j;
  int len_j;
  int offset_j;
  int code;
  int len;
  int offset;
  float prev_cost;
  int reach;
  int first_offset_is_constant;
  double offset_cost;
  int len_prev;
  int offset_prev;
  CostManager *cost_manager;
  VP8LColorCache hashers;
  CostModel *cost_model;
  size_t cost_model_size;
  size_t literal_array_size;
  int use_color_cache;
  int pix_count;
  int cc_init;
  int ok;
  int i;
  VP8LColorCache *in_stack_ffffffffffffff48;
  int *length_ptr;
  CostModel *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  float prev_cost_00;
  int cache_bits_00;
  int xsize_00;
  CostModel *m;
  int iVar2;
  int iVar3;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int local_34;
  uint local_30;
  int local_2c;
  
  local_30 = 0;
  local_34 = 0;
  if (in_ECX < 1) {
    do_clean_intervals = 0;
  }
  else {
    do_clean_intervals = 1 << ((byte)in_ECX & 0x1f);
  }
  manager = (CostManager *)((long)(do_clean_intervals + 0x118) * 8 + 0x1948);
  distance_cost =
       WebPSafeCalloc(CONCAT44(in_stack_ffffffffffffff5c,do_clean_intervals),
                      (size_t)in_stack_ffffffffffffff50);
  argb_00 = (uint32_t *)
            WebPSafeMalloc(CONCAT44(in_stack_ffffffffffffff5c,do_clean_intervals),
                           (size_t)in_stack_ffffffffffffff50);
  iVar3 = -1;
  iVar2 = -1;
  m = (CostModel *)0xbff0000000000000;
  xsize_00 = -1;
  cache_bits_00 = 0;
  if ((((distance_cost != (void *)0x0) && (argb_00 != (uint32_t *)0x0)) &&
      ((*(long *)((long)distance_cost + 0x1940) = (long)distance_cost + 0x1948, in_ECX < 1 ||
       (local_34 = VP8LColorCacheInit(in_stack_ffffffffffffff48,0), local_34 != 0)))) &&
     ((iVar1 = CostModelBuild(m,xsize_00,cache_bits_00,
                              (VP8LBackwardRefs *)
                              CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)),
      iVar1 != 0 &&
      (iVar1 = CostManagerInit((CostManager *)CONCAT44(xsize_00,cache_bits_00),
                               (uint16_t *)
                               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                               in_stack_ffffffffffffff6c,
                               (CostModel *)
                               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)),
      iVar1 != 0)))) {
    *(undefined2 *)in_stack_00000008 = 0;
    length_ptr = in_stack_00000008;
    AddSingleLiteralWithCostModel
              (argb_00,(VP8LColorCache *)CONCAT44(iVar3,iVar2),m,xsize_00,cache_bits_00,
               in_stack_ffffffffffffff74,
               (float *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               (uint16_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    for (local_2c = 1; local_2c < in_EDI * in_ESI; local_2c = local_2c + 1) {
      prev_cost_00 = *(float *)(*(long *)(argb_00 + 0x2006) + (long)(local_2c + -1) * 4);
      VP8LHashChainFindCopy
                ((VP8LHashChain *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c,(int *)in_stack_ffffffffffffff50,length_ptr);
      length_ptr = in_stack_00000008;
      AddSingleLiteralWithCostModel
                (argb_00,(VP8LColorCache *)CONCAT44(iVar3,iVar2),m,xsize_00,cache_bits_00,
                 prev_cost_00,(float *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                 ,(uint16_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      if (1 < in_stack_ffffffffffffff6c) {
        if (in_stack_ffffffffffffff70 == iVar3) {
          if (xsize_00 != 0) {
            cache_bits_00 = local_2c + iVar2 + -2;
            xsize_00 = 0;
          }
          if (cache_bits_00 < local_2c + in_stack_ffffffffffffff6c + -1) {
            in_stack_ffffffffffffff60 = 0;
            for (in_stack_ffffffffffffff5c = local_2c; in_stack_ffffffffffffff5c <= cache_bits_00;
                in_stack_ffffffffffffff5c = in_stack_ffffffffffffff5c + 1) {
              VP8LHashChainFindCopy
                        ((VP8LHashChain *)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         in_stack_ffffffffffffff5c,(int *)in_stack_ffffffffffffff50,length_ptr);
              if (in_stack_ffffffffffffff64 != in_stack_ffffffffffffff70) {
                VP8LHashChainFindCopy
                          ((VP8LHashChain *)
                           CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           in_stack_ffffffffffffff5c,(int *)in_stack_ffffffffffffff50,length_ptr);
                break;
              }
            }
            UpdateCostAtIndex((CostManager *)
                              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                              in_stack_ffffffffffffff5c,do_clean_intervals);
            UpdateCostAtIndex((CostManager *)
                              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                              in_stack_ffffffffffffff5c,do_clean_intervals);
            PushInterval(manager,(double)distance_cost,in_stack_ffffffffffffffa4,
                         in_stack_ffffffffffffffa0);
            cache_bits_00 = in_stack_ffffffffffffff5c + in_stack_ffffffffffffff60 + -1;
          }
        }
        else {
          in_stack_ffffffffffffff68 = VP8LDistanceToPlaneCode(in_EDI,in_stack_ffffffffffffff70);
          m = (CostModel *)
              GetDistanceCost(in_stack_ffffffffffffff50,(uint32_t)((ulong)length_ptr >> 0x20));
          xsize_00 = 1;
          PushInterval(manager,(double)distance_cost,in_stack_ffffffffffffffa4,
                       in_stack_ffffffffffffffa0);
        }
      }
      UpdateCostAtIndex((CostManager *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                        ,in_stack_ffffffffffffff5c,do_clean_intervals);
      iVar2 = in_stack_ffffffffffffff6c;
      iVar3 = in_stack_ffffffffffffff70;
    }
    local_30 = (uint)((*(int *)(in_R9 + 4) != 0 ^ 0xffU) & 1);
  }
  if (local_34 != 0) {
    VP8LColorCacheClear((VP8LColorCache *)0x1a1a09);
  }
  CostManagerClear((CostManager *)0x1a1a13);
  WebPSafeFree((void *)0x1a1a1d);
  WebPSafeFree((void *)0x1a1a27);
  return local_30;
}

Assistant:

static int BackwardReferencesHashChainDistanceOnly(
    int xsize, int ysize, const uint32_t* const argb, int cache_bits,
    const VP8LHashChain* const hash_chain, const VP8LBackwardRefs* const refs,
    uint16_t* const dist_array) {
  int i;
  int ok = 0;
  int cc_init = 0;
  const int pix_count = xsize * ysize;
  const int use_color_cache = (cache_bits > 0);
  const size_t literal_array_size =
      sizeof(double) * (NUM_LITERAL_CODES + NUM_LENGTH_CODES +
                        ((cache_bits > 0) ? (1 << cache_bits) : 0));
  const size_t cost_model_size = sizeof(CostModel) + literal_array_size;
  CostModel* const cost_model =
      (CostModel*)WebPSafeCalloc(1ULL, cost_model_size);
  VP8LColorCache hashers;
  CostManager* cost_manager =
      (CostManager*)WebPSafeMalloc(1ULL, sizeof(*cost_manager));
  int offset_prev = -1, len_prev = -1;
  double offset_cost = -1;
  int first_offset_is_constant = -1;  // initialized with 'impossible' value
  int reach = 0;

  if (cost_model == NULL || cost_manager == NULL) goto Error;

  cost_model->literal_ = (double*)(cost_model + 1);
  if (use_color_cache) {
    cc_init = VP8LColorCacheInit(&hashers, cache_bits);
    if (!cc_init) goto Error;
  }

  if (!CostModelBuild(cost_model, xsize, cache_bits, refs)) {
    goto Error;
  }

  if (!CostManagerInit(cost_manager, dist_array, pix_count, cost_model)) {
    goto Error;
  }

  // We loop one pixel at a time, but store all currently best points to
  // non-processed locations from this point.
  dist_array[0] = 0;
  // Add first pixel as literal.
  AddSingleLiteralWithCostModel(argb, &hashers, cost_model, 0, use_color_cache,
                                0.f, cost_manager->costs_, dist_array);

  for (i = 1; i < pix_count; ++i) {
    const float prev_cost = cost_manager->costs_[i - 1];
    int offset, len;
    VP8LHashChainFindCopy(hash_chain, i, &offset, &len);

    // Try adding the pixel as a literal.
    AddSingleLiteralWithCostModel(argb, &hashers, cost_model, i,
                                  use_color_cache, prev_cost,
                                  cost_manager->costs_, dist_array);

    // If we are dealing with a non-literal.
    if (len >= 2) {
      if (offset != offset_prev) {
        const int code = VP8LDistanceToPlaneCode(xsize, offset);
        offset_cost = GetDistanceCost(cost_model, code);
        first_offset_is_constant = 1;
        PushInterval(cost_manager, prev_cost + offset_cost, i, len);
      } else {
        assert(offset_cost >= 0);
        assert(len_prev >= 0);
        assert(first_offset_is_constant == 0 || first_offset_is_constant == 1);
        // Instead of considering all contributions from a pixel i by calling:
        //         PushInterval(cost_manager, prev_cost + offset_cost, i, len);
        // we optimize these contributions in case offset_cost stays the same
        // for consecutive pixels. This describes a set of pixels similar to a
        // previous set (e.g. constant color regions).
        if (first_offset_is_constant) {
          reach = i - 1 + len_prev - 1;
          first_offset_is_constant = 0;
        }

        if (i + len - 1 > reach) {
          // We can only be go further with the same offset if the previous
          // length was maxed, hence len_prev == len == MAX_LENGTH.
          // TODO(vrabaud), bump i to the end right away (insert cache and
          // update cost).
          // TODO(vrabaud), check if one of the points in between does not have
          // a lower cost.
          // Already consider the pixel at "reach" to add intervals that are
          // better than whatever we add.
          int offset_j, len_j = 0;
          int j;
          assert(len == MAX_LENGTH || len == pix_count - i);
          // Figure out the last consecutive pixel within [i, reach + 1] with
          // the same offset.
          for (j = i; j <= reach; ++j) {
            VP8LHashChainFindCopy(hash_chain, j + 1, &offset_j, &len_j);
            if (offset_j != offset) {
              VP8LHashChainFindCopy(hash_chain, j, &offset_j, &len_j);
              break;
            }
          }
          // Update the cost at j - 1 and j.
          UpdateCostAtIndex(cost_manager, j - 1, 0);
          UpdateCostAtIndex(cost_manager, j, 0);

          PushInterval(cost_manager, cost_manager->costs_[j - 1] + offset_cost,
                       j, len_j);
          reach = j + len_j - 1;
        }
      }
    }

    UpdateCostAtIndex(cost_manager, i, 1);
    offset_prev = offset;
    len_prev = len;
  }

  ok = !refs->error_;
Error:
  if (cc_init) VP8LColorCacheClear(&hashers);
  CostManagerClear(cost_manager);
  WebPSafeFree(cost_model);
  WebPSafeFree(cost_manager);
  return ok;
}